

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O0

int Bbr_BuildTreeNode(DdManager *dd,int nNodes,Bbr_ImageNode_t **pNodes,int nVars,
                     Bbr_ImageVar_t **pVars,int *pfStop,int nBddMax)

{
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  int local_8c;
  int v;
  int nSupp;
  int iVarBest;
  int iNode2;
  int iNode1;
  DdNode *bSuppTemp;
  DdNode *bTemp;
  DdNode *bCube;
  Bbr_ImageNode_t *pNode;
  Bbr_ImageVar_t *pVar;
  Bbr_ImageNode_t *pNode2;
  Bbr_ImageNode_t *pNode1;
  int *pfStop_local;
  Bbr_ImageVar_t **pVars_local;
  Bbr_ImageNode_t **ppBStack_28;
  int nVars_local;
  Bbr_ImageNode_t **pNodes_local;
  DdManager *pDStack_18;
  int nNodes_local;
  DdManager *dd_local;
  
  pNode1 = (Bbr_ImageNode_t *)pfStop;
  pfStop_local = (int *)pVars;
  pVars_local._4_4_ = nVars;
  ppBStack_28 = pNodes;
  pNodes_local._4_4_ = nNodes;
  pDStack_18 = dd;
  iVar1 = Bbr_FindBestVariable(dd,nNodes,pNodes,nVars,pVars);
  if (iVar1 == -1) {
    dd_local._4_4_ = 0;
  }
  else {
    pNode = *(Bbr_ImageNode_t **)(pfStop_local + (long)iVar1 * 2);
    iVar2 = Cudd_SupportSize(pDStack_18,pNode->bCube);
    if (iVar2 != *(int *)&pNode->bImage) {
      __assert_fail("nSupp == pVar->nParts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/bbr/bbrImage.c"
                    ,0x2f1,
                    "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                   );
    }
    if (iVar2 == 1) {
      __assert_fail("nSupp != 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/bbr/bbrImage.c"
                    ,0x2f2,
                    "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                   );
    }
    if (*(int *)&pNode->bImage == 2) {
      iVarBest = pNode->bCube->index;
      nSupp = ((pNode->bCube->type).kids.T)->index;
      pNode2 = ppBStack_28[iVarBest];
      pVar = (Bbr_ImageVar_t *)ppBStack_28[nSupp];
      bTemp = pDStack_18->vars[*(int *)&pNode->dd];
      Cudd_Ref(bTemp);
      for (local_8c = 0; local_8c < pVars_local._4_4_; local_8c = local_8c + 1) {
        if (((*(long *)(pfStop_local + (long)local_8c * 2) != 0) && (local_8c != iVar1)) &&
           (*(long *)(*(long *)(pfStop_local + (long)local_8c * 2) + 8) ==
            *(long *)(*(long *)(pfStop_local + (long)iVar1 * 2) + 8))) {
          bSuppTemp = bTemp;
          bTemp = Cudd_bddAnd(pDStack_18,bTemp,
                              pDStack_18->vars[**(int **)(pfStop_local + (long)local_8c * 2)]);
          Cudd_Ref(bTemp);
          Cudd_RecursiveDeref(pDStack_18,bSuppTemp);
          Cudd_RecursiveDeref(pDStack_18,
                              *(DdNode **)(*(long *)(pfStop_local + (long)local_8c * 2) + 8));
          if (*(long *)(pfStop_local + (long)local_8c * 2) != 0) {
            free(*(void **)(pfStop_local + (long)local_8c * 2));
            (pfStop_local + (long)local_8c * 2)[0] = 0;
            (pfStop_local + (long)local_8c * 2)[1] = 0;
          }
        }
      }
      Cudd_RecursiveDeref(pDStack_18,*(DdNode **)(*(long *)(pfStop_local + (long)iVar1 * 2) + 8));
      if (*(long *)(pfStop_local + (long)iVar1 * 2) != 0) {
        free(*(void **)(pfStop_local + (long)iVar1 * 2));
        (pfStop_local + (long)iVar1 * 2)[0] = 0;
        (pfStop_local + (long)iVar1 * 2)[1] = 0;
      }
      bCube = (DdNode *)Bbr_CombineTwoNodes(pDStack_18,bTemp,pNode2,(Bbr_ImageNode_t *)pVar);
      Cudd_RecursiveDeref(pDStack_18,bTemp);
    }
    else {
      Bbr_FindBestPartitions
                (pDStack_18,pNode->bCube,pNodes_local._4_4_,ppBStack_28,&iVarBest,&nSupp);
      pNode2 = ppBStack_28[iVarBest];
      pVar = (Bbr_ImageVar_t *)ppBStack_28[nSupp];
      bCube = (DdNode *)
              Bbr_CombineTwoNodes(pDStack_18,pDStack_18->one,pNode2,(Bbr_ImageNode_t *)pVar);
    }
    ppBStack_28[iVarBest] = (Bbr_ImageNode_t *)bCube;
    ppBStack_28[nSupp] = (Bbr_ImageNode_t *)0x0;
    for (_iNode2 = *(DdNode **)(*(long *)&pVar[1].nParts + 8); _iNode2 != pDStack_18->one;
        _iNode2 = (_iNode2->type).kids.T) {
      pNode = *(Bbr_ImageNode_t **)(pfStop_local + (ulong)_iNode2->index * 2);
      if (pNode != (Bbr_ImageNode_t *)0x0) {
        iVar1 = Cudd_bddLeq(pDStack_18,pNode->bCube,pDStack_18->vars[nSupp]);
        if (iVar1 == 0) {
          __assert_fail("Cudd_bddLeq( dd, pVar->bParts, dd->vars[iNode2] )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/bbr/bbrImage.c"
                        ,0x333,
                        "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                       );
        }
        bSuppTemp = pNode->bCube;
        pDVar3 = Cudd_bddExistAbstract(pDStack_18,bSuppTemp,pDStack_18->vars[nSupp]);
        pNode->bCube = pDVar3;
        Cudd_Ref(pNode->bCube);
        Cudd_RecursiveDeref(pDStack_18,bSuppTemp);
        bSuppTemp = pNode->bCube;
        pDVar3 = Cudd_bddAnd(pDStack_18,bSuppTemp,pDStack_18->vars[iVarBest]);
        pNode->bCube = pDVar3;
        Cudd_Ref(pNode->bCube);
        Cudd_RecursiveDeref(pDStack_18,bSuppTemp);
        iVar1 = Cudd_SupportSize(pDStack_18,pNode->bCube);
        *(int *)&pNode->bImage = iVar1;
      }
    }
    *(undefined4 *)&pNode1->dd = 0;
    if ((uint)nBddMax < pDStack_18->keys - pDStack_18->dead) {
      *(undefined4 *)&pNode1->dd = 1;
      dd_local._4_4_ = 0;
    }
    else {
      dd_local._4_4_ = 1;
    }
  }
  return dd_local._4_4_;
}

Assistant:

int Bbr_BuildTreeNode( DdManager * dd, 
    int nNodes, Bbr_ImageNode_t ** pNodes, 
    int nVars,  Bbr_ImageVar_t ** pVars, int * pfStop, int nBddMax )
{
    Bbr_ImageNode_t * pNode1, * pNode2;
    Bbr_ImageVar_t * pVar;
    Bbr_ImageNode_t * pNode;
    DdNode * bCube, * bTemp, * bSuppTemp;//, * bParts;
    int iNode1, iNode2;
    int iVarBest, nSupp, v;

    // find the best variable
    iVarBest = Bbr_FindBestVariable( dd, nNodes, pNodes, nVars, pVars );
    if ( iVarBest == -1 )
        return 0;
/*
for ( v = 0; v < nVars; v++ )
{
    DdNode * bSupp;
    if ( pVars[v] == NULL )
        continue;
    printf( "%3d :", v );
    printf( "%3d ", pVars[v]->nParts );
    bSupp = Cudd_Support( dd, pVars[v]->bParts );  Cudd_Ref( bSupp );
    Bbr_bddPrint( dd, bSupp ); printf( "\n" );
    Cudd_RecursiveDeref( dd, bSupp );
}
*/
    pVar = pVars[iVarBest];

    // this var cannot appear in one partition only
    nSupp = Cudd_SupportSize( dd, pVar->bParts );
    assert( nSupp == pVar->nParts );
    assert( nSupp != 1 );
//printf( "var = %d  supp = %d\n\n", iVarBest, nSupp );

    // if it appears in only two partitions, quantify it
    if ( pVar->nParts == 2 )
    {
        // get the nodes
        iNode1 = pVar->bParts->index;
        iNode2 = cuddT(pVar->bParts)->index;
        pNode1 = pNodes[iNode1];
        pNode2 = pNodes[iNode2];

        // get the quantification cube
        bCube = dd->vars[pVar->iNum];    Cudd_Ref( bCube );
        // add the variables that appear only in these partitions
        for ( v = 0; v < nVars; v++ )
            if ( pVars[v] && v != iVarBest && pVars[v]->bParts == pVars[iVarBest]->bParts )
            {
                // add this var
                bCube = Cudd_bddAnd( dd, bTemp = bCube, dd->vars[pVars[v]->iNum] );   Cudd_Ref( bCube );
                Cudd_RecursiveDeref( dd, bTemp );
                // clean this var
                Cudd_RecursiveDeref( dd, pVars[v]->bParts );
                ABC_FREE( pVars[v] );
            }
        // clean the best var
        Cudd_RecursiveDeref( dd, pVars[iVarBest]->bParts );
        ABC_FREE( pVars[iVarBest] );

        // combines two nodes
        pNode = Bbr_CombineTwoNodes( dd, bCube, pNode1, pNode2 );
        Cudd_RecursiveDeref( dd, bCube );
    }
    else // if ( pVar->nParts > 2 )
    {
        // find two smallest BDDs that have this var
        Bbr_FindBestPartitions( dd, pVar->bParts, nNodes, pNodes, &iNode1, &iNode2 );
        pNode1 = pNodes[iNode1];
        pNode2 = pNodes[iNode2];
//printf( "smallest bdds with this var: %d %d\n", iNode1, iNode2 );
/*
        // it is not possible that a var appears only in these two
        // otherwise, it would have a different cost
        bParts = Cudd_bddAnd( dd, dd->vars[iNode1], dd->vars[iNode2] ); Cudd_Ref( bParts );
        for ( v = 0; v < nVars; v++ )
            if ( pVars[v] && pVars[v]->bParts == bParts )
                assert( 0 );
        Cudd_RecursiveDeref( dd, bParts );
*/
        // combines two nodes
        pNode = Bbr_CombineTwoNodes( dd, b1, pNode1, pNode2 );
    }

    // clean the old nodes
    pNodes[iNode1] = pNode;
    pNodes[iNode2] = NULL;
//printf( "Removing node %d (leaving node %d)\n", iNode2, iNode1 );
    
    // update the variables that appear in pNode[iNode2]
    for ( bSuppTemp = pNode2->pPart->bSupp; bSuppTemp != b1; bSuppTemp = cuddT(bSuppTemp) )
    {
        pVar = pVars[bSuppTemp->index];
        if ( pVar == NULL ) // this variable is not be quantified
            continue;
        // quantify this var
        assert( Cudd_bddLeq( dd, pVar->bParts, dd->vars[iNode2] ) );
        pVar->bParts = Cudd_bddExistAbstract( dd, bTemp = pVar->bParts, dd->vars[iNode2] ); Cudd_Ref( pVar->bParts );
        Cudd_RecursiveDeref( dd, bTemp );
        // add the new var
        pVar->bParts = Cudd_bddAnd( dd, bTemp = pVar->bParts, dd->vars[iNode1] ); Cudd_Ref( pVar->bParts );
        Cudd_RecursiveDeref( dd, bTemp );
        // update the score
        pVar->nParts = Cudd_SupportSize( dd, pVar->bParts );
    }

    *pfStop = 0;
    if ( dd->keys-dd->dead > (unsigned)nBddMax )
    {
        *pfStop = 1;
        return 0;
    }
    return 1;
}